

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_ceiling.cpp
# Opt level: O2

void __thiscall DCeiling::Serialize(DCeiling *this,FSerializer *arc)

{
  FSerializer *pFVar1;
  
  DMover::Serialize((DMover *)this,arc);
  pFVar1 = FSerializer::Enum<DCeiling::ECeiling>(arc,"type",&this->m_Type);
  pFVar1 = FSerializer::operator()(pFVar1,"bottomheight",&this->m_BottomHeight);
  pFVar1 = FSerializer::operator()(pFVar1,"topheight",&this->m_TopHeight);
  pFVar1 = FSerializer::operator()(pFVar1,"speed",&this->m_Speed);
  pFVar1 = FSerializer::operator()(pFVar1,"speed1",&this->m_Speed1);
  pFVar1 = FSerializer::operator()(pFVar1,"speed2",&this->m_Speed2);
  pFVar1 = FSerializer::operator()(pFVar1,"crush",&this->m_Crush);
  pFVar1 = FSerializer::operator()(pFVar1,"silent",&this->m_Silent);
  pFVar1 = FSerializer::operator()(pFVar1,"direction",&this->m_Direction);
  pFVar1 = FSerializer::operator()(pFVar1,"texture",&this->m_Texture);
  pFVar1 = FSerializer::operator()(pFVar1,"newspecial",&this->m_NewSpecial);
  pFVar1 = FSerializer::operator()(pFVar1,"tag",&this->m_Tag);
  pFVar1 = FSerializer::operator()(pFVar1,"olddirecton",&this->m_OldDirection);
  FSerializer::Enum<DCeiling::ECrushMode>(pFVar1,"crushmode",&this->m_CrushMode);
  return;
}

Assistant:

void DCeiling::Serialize(FSerializer &arc)
{
	Super::Serialize (arc);
	arc.Enum("type", m_Type)
		("bottomheight", m_BottomHeight)
		("topheight", m_TopHeight)
		("speed", m_Speed)
		("speed1", m_Speed1)
		("speed2", m_Speed2)
		("crush", m_Crush)
		("silent", m_Silent)
		("direction", m_Direction)
		("texture", m_Texture)
		("newspecial", m_NewSpecial)
		("tag", m_Tag)
		("olddirecton", m_OldDirection)
		.Enum("crushmode", m_CrushMode);
}